

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

double Logger::log(double __x)

{
  char cVar1;
  int iVar2;
  long lVar3;
  __shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *this;
  char in_AL;
  pthread_t pVar5;
  ulong uVar6;
  int *piVar7;
  undefined8 *puVar8;
  longlong *plVar9;
  double *pdVar10;
  LogEvent *this_00;
  FileAppender *this_01;
  ConsoleAppender *this_02;
  long *in_RCX;
  ulong uVar11;
  string *in_RDX;
  uint uVar12;
  uint32_t in_ESI;
  Level in_EDI;
  long lVar13;
  ulong uVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  va_list valist;
  ptr appender;
  __shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  ptr event;
  string content;
  __shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2> local_158;
  string local_148;
  string parmString;
  string local_108;
  double local_e8 [6];
  undefined1 local_b8 [16];
  
  if (in_AL != '\0') {
    local_b8._8_4_ = in_XMM0_Dc;
    local_b8._0_8_ = __x;
    local_b8._12_4_ = in_XMM0_Dd;
  }
  if ((int)m_level <= (int)in_EDI) {
    pVar5 = pthread_self();
    uVar6 = time((time_t *)0x0);
    content._M_dataplus._M_p = (pointer)&content.field_2;
    content._M_string_length = 0;
    content.field_2._M_local_buf[0] = '\0';
    iVar2 = (int)in_RCX[1];
    valist[0].overflow_arg_area = &stack0x00000008;
    parmString._M_dataplus._M_p = (pointer)&parmString.field_2;
    parmString._M_string_length = 0;
    valist[0].gp_offset = 0x20;
    valist[0].fp_offset = 0x30;
    parmString.field_2._M_local_buf[0] = '\0';
    uVar12 = 0;
    while ((int)uVar12 < iVar2) {
      lVar13 = (long)(int)uVar12;
      uVar11 = lVar13 + 1;
      lVar3 = *in_RCX;
      if (*(char *)(lVar3 + lVar13) != '%' || iVar2 <= (int)uVar11) {
        std::__cxx11::string::push_back((char)&content);
        uVar11 = (ulong)uVar12;
        goto switchD_00104bc1_caseD_65;
      }
      cVar1 = *(char *)(lVar3 + uVar11);
      switch(cVar1) {
      case 'c':
        if (valist[0].gp_offset < 0x29) {
          valist[0].gp_offset = valist[0].gp_offset + 8;
        }
        else {
          valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
        }
LAB_00104ce2:
        std::__cxx11::string::push_back((char)&content);
        break;
      case 'd':
        uVar14 = valist[0]._0_8_ & 0xffffffff;
        if (uVar14 < 0x29) {
          valist[0].gp_offset = valist[0].gp_offset + 8;
          piVar7 = (int *)((long)local_e8 + uVar14);
        }
        else {
          piVar7 = (int *)valist[0].overflow_arg_area;
          valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
        }
        std::__cxx11::to_string((string *)&event,*piVar7);
        goto LAB_00104d38;
      case 'e':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
        break;
      case 'f':
        uVar14 = (ulong)valist[0].fp_offset;
        if (uVar14 < 0xa1) {
          valist[0].fp_offset = valist[0].fp_offset + 0x10;
          pdVar10 = (double *)((long)local_e8 + uVar14);
        }
        else {
          pdVar10 = (double *)valist[0].overflow_arg_area;
          valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
        }
        std::__cxx11::to_string((string *)&event,*pdVar10);
LAB_00104d38:
        std::__cxx11::string::operator=((string *)&parmString,(string *)&event);
        std::__cxx11::string::~string((string *)&event);
        std::__cxx11::string::append((string *)&content);
        break;
      case 'l':
        uVar14 = lVar13 + 2;
        if ((int)uVar14 < iVar2) {
          if (*(char *)(lVar3 + uVar14) == 'd') {
            uVar11 = valist[0]._0_8_ & 0xffffffff;
            if (uVar11 < 0x29) {
              valist[0].gp_offset = valist[0].gp_offset + 8;
              plVar9 = (longlong *)((long)local_e8 + uVar11);
            }
            else {
              plVar9 = (longlong *)valist[0].overflow_arg_area;
              valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
            }
            std::__cxx11::to_string((string *)&event,*plVar9);
          }
          else {
            if (*(char *)(lVar3 + uVar14) != 'f') goto LAB_00104f89;
            uVar11 = (ulong)valist[0].fp_offset;
            if (uVar11 < 0xa1) {
              valist[0].fp_offset = valist[0].fp_offset + 0x10;
              pdVar10 = (double *)((long)local_e8 + uVar11);
            }
            else {
              pdVar10 = (double *)valist[0].overflow_arg_area;
              valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
            }
            std::__cxx11::to_string((string *)&event,*pdVar10);
          }
          std::__cxx11::string::operator=((string *)&parmString,(string *)&event);
          std::__cxx11::string::~string((string *)&event);
          std::__cxx11::string::append((string *)&content);
          uVar11 = uVar14 & 0xffffffff;
        }
        break;
      default:
        if (cVar1 == '%') goto LAB_00104ce2;
        if (cVar1 == 's') {
          uVar14 = valist[0]._0_8_ & 0xffffffff;
          if (uVar14 < 0x29) {
            valist[0].gp_offset = valist[0].gp_offset + 8;
            puVar8 = (undefined8 *)((long)local_e8 + uVar14);
          }
          else {
            puVar8 = (undefined8 *)valist[0].overflow_arg_area;
            valist[0].overflow_arg_area = (void *)((long)valist[0].overflow_arg_area + 8);
          }
          std::__cxx11::string::string((string *)&event,(char *)*puVar8,(allocator *)&appender);
          goto LAB_00104d38;
        }
      }
switchD_00104bc1_caseD_65:
      uVar12 = (int)uVar11 + 1;
    }
    this_00 = (LogEvent *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_148,in_RDX);
    std::__cxx11::string::string((string *)&local_108,(string *)&content);
    LogEvent::LogEvent(this_00,in_ESI,(uint32_t)pVar5,uVar6 & 0xffffffff,in_EDI,&local_148,
                       &local_108);
    std::__shared_ptr<LogEvent,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LogEvent,void>
              ((__shared_ptr<LogEvent,(__gnu_cxx::_Lock_policy)2> *)&event,this_00);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_148);
    appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (m_target == FILE) {
      this_01 = (FileAppender *)operator_new(0x18);
      std::__shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_158,&event.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>);
      FileAppender::FileAppender(this_01,(ptr *)&local_158);
      std::__shared_ptr<Appender,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileAppender,void>
                ((__shared_ptr<Appender,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,this_01);
      std::__shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>,&local_1e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      p_Var4 = &local_158;
    }
    else {
      this_02 = (ConsoleAppender *)operator_new(0x18);
      std::__shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_168,&event.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>);
      ConsoleAppender::ConsoleAppender(this_02,(ptr *)&local_168);
      std::__shared_ptr<Appender,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ConsoleAppender,void>
                ((__shared_ptr<Appender,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,this_02);
      std::__shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>,&local_1e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      p_Var4 = &local_168;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var4->_M_refcount);
    this = m_threadPool.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_178,&appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>);
    ThreadPool::add(this,(SP_Appender *)&local_178);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&event.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00104f89:
    std::__cxx11::string::~string((string *)&parmString);
    __x = (double)std::__cxx11::string::~string((string *)&content);
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel::Level level,uint32_t line,std::string funName,std::string format,...)
{
	if(level<m_level)
		return;
	uint32_t threadId=pthread_self();
	uint32_t nowTime=time(0);
	std::string content;
	int fmt_status=0;
	int formatLength=format.length();
	va_list valist;
	va_start(valist,format);
	std::string parmString;
	for(int i=0;i<formatLength;i++){
	 	if(i+1<formatLength&&format[i]=='%'){
			switch(format[++i]){
			case 'd':
				parmString=std::to_string(va_arg(valist,int));
				content.append(parmString);
				break;
			case 's':
				parmString=std::string(va_arg(valist,char*));
				content.append(parmString);
				break;
			case 'c':
				content.push_back(static_cast<char>(va_arg(valist,int)));
				break;
			case 'f':
				parmString=std::to_string(va_arg(valist,double));
				content.append(parmString);
				break;
			case 'l':
				if(i+1<formatLength){
					if(format[i+1]=='f'){
						i++;
						parmString=std::to_string(va_arg(valist,double));
						content.append(parmString);
					}
					else if(format[i+1]=='d'){
						i++;
						parmString=std::to_string(va_arg(valist,long long));
						content.append(parmString);
					}
					else
						return;
				}
				break;
			case '%':
				content.push_back('%');
				break;
			}
		}
		else{
			content.push_back(format[i]);
		}
	}
	LogEvent::ptr event(new LogEvent(line,threadId,nowTime,level,funName,content));
	Appender::ptr appender=nullptr;
	if(m_target==LogTarget::FILE){
		appender=Appender::ptr(new FileAppender(event));
	}
	else{
		appender=Appender::ptr(new ConsoleAppender(event));
	}
	m_threadPool->add(appender);
}